

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

TypeInfo * readTypeInfo(TypeInfo *__return_storage_ptr__,XMLElement *element)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined4 extraout_var_00;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  XMLNode *local_88;
  XMLNode *nextSibling;
  string local_78;
  string local_58;
  XMLNode *local_28;
  XMLNode *previousSibling;
  XMLElement *local_18;
  XMLElement *element_local;
  TypeInfo *typeInfo;
  
  previousSibling._7_1_ = 0;
  local_18 = element;
  element_local = (XMLElement *)__return_storage_ptr__;
  TypeInfo::TypeInfo(__return_storage_ptr__);
  local_28 = tinyxml2::XMLNode::PreviousSibling(&local_18->super_XMLNode);
  if ((local_28 != (XMLNode *)0x0) &&
     (iVar1 = (*local_28->_vptr_XMLNode[7])(), CONCAT44(extraout_var,iVar1) != 0)) {
    pcVar2 = tinyxml2::XMLNode::Value(local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar2,(allocator<char> *)((long)&nextSibling + 7));
    trim(&local_58,&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__return_storage_ptr__->prefix,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nextSibling + 7));
  }
  pcVar2 = tinyxml2::XMLElement::GetText(local_18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->type,pcVar2);
  local_88 = tinyxml2::XMLNode::NextSibling(&local_18->super_XMLNode);
  if ((local_88 != (XMLNode *)0x0) &&
     (iVar1 = (*local_88->_vptr_XMLNode[7])(), CONCAT44(extraout_var_00,iVar1) != 0)) {
    pcVar2 = tinyxml2::XMLNode::Value(local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar2,&local_e9);
    trimEnd(&local_c8,&local_e8);
    trimStars(&local_a8,&local_c8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__return_storage_ptr__->postfix,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

inline TypeInfo readTypeInfo( tinyxml2::XMLElement const * element )
{
  TypeInfo                  typeInfo;
  tinyxml2::XMLNode const * previousSibling = element->PreviousSibling();
  if ( previousSibling && previousSibling->ToText() )
  {
    typeInfo.prefix = trim( previousSibling->Value() );
  }
  typeInfo.type                         = element->GetText();
  tinyxml2::XMLNode const * nextSibling = element->NextSibling();
  if ( nextSibling && nextSibling->ToText() )
  {
    typeInfo.postfix = trimStars( trimEnd( nextSibling->Value() ) );
  }
  return typeInfo;
}